

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_manyvector.c
# Opt level: O1

sunrealtype N_VL1NormLocal_ManyVector(N_Vector x)

{
  long *plVar1;
  long lVar2;
  sunrealtype sVar3;
  double dVar4;
  
  plVar1 = (long *)x->content;
  if (*plVar1 < 1) {
    sVar3 = 0.0;
  }
  else {
    sVar3 = 0.0;
    lVar2 = 0;
    do {
      dVar4 = (double)N_VL1Norm(*(undefined8 *)(plVar1[2] + lVar2 * 8));
      sVar3 = sVar3 + dVar4;
      lVar2 = lVar2 + 1;
      plVar1 = (long *)x->content;
    } while (lVar2 < *plVar1);
  }
  return sVar3;
}

Assistant:

sunrealtype MVAPPEND(N_VL1NormLocal)(N_Vector x)
{
  SUNFunctionBegin(x->sunctx);
  sunindextype i;
  sunrealtype sum;
#ifdef MANYVECTOR_BUILD_WITH_MPI
  sunrealtype contrib;
  int rank;
#endif

  /* initialize output*/
  sum = ZERO;

  for (i = 0; i < MANYVECTOR_NUM_SUBVECS(x); i++)
  {
#ifdef MANYVECTOR_BUILD_WITH_MPI

    /* check for nvl1normlocal in subvector */
    if (MANYVECTOR_SUBVEC(x, i)->ops->nvl1normlocal)
    {
      sum += N_VL1NormLocal(MANYVECTOR_SUBVEC(x, i));
      SUNCheckLastErrNoRet();

      /* otherwise, call nvl1norm and root tasks accumulate to overall sum */
    }
    else
    {
      contrib = N_VL1Norm(MANYVECTOR_SUBVEC(x, i));
      SUNCheckLastErrNoRet();

      /* get this task's rank in subvector communicator (note: serial
         subvectors will result in rank==0) */
      rank = SubvectorMPIRank(MANYVECTOR_SUBVEC(x, i));
      if (rank < 0) { return (ZERO); }
      if (rank == 0) { sum += contrib; }
    }

#else

    /* accumulate subvector contribution to overall sum */
    sum += N_VL1Norm(MANYVECTOR_SUBVEC(x, i));
    SUNCheckLastErrNoRet();

#endif
  }

  return (sum);
}